

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_classes.h
# Opt level: O3

filtered_directed_graph_t *
read_filtered_directed_graph
          (filtered_directed_graph_t *__return_storage_ptr__,string *input_filename,
          flagser_parameters *params)

{
  string *__rhs;
  pointer pcVar1;
  string sVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long *plVar6;
  invalid_argument *this;
  flagser_parameters *pfVar7;
  filtered_directed_graph_t *__return_storage_ptr___00;
  string err_msg;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"reading in the graph",0x14);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r",1);
  __rhs = &params->input_format;
  iVar3 = std::__cxx11::string::compare((char *)__rhs);
  if (((iVar3 == 0) || ((params->hdf5_type)._M_string_length != 0)) ||
     (lVar5 = std::__cxx11::string::rfind((char *)input_filename,0x1173f7,0xffffffffffffffff),
     lVar5 != -1)) {
    local_40[0] = local_30;
    pfVar7 = (flagser_parameters *)(input_filename->_M_dataplus)._M_p;
    __return_storage_ptr___00 = (filtered_directed_graph_t *)local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr___00,pfVar7,
               (pointer)((long)&pfVar7->max_dimension + input_filename->_M_string_length));
    sVar2._M_string_length = in_stack_ffffffffffffff60;
    sVar2._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff58;
    sVar2.field_2._M_allocated_capacity = in_stack_ffffffffffffff68;
    sVar2.field_2._8_8_ = in_stack_ffffffffffffff70;
    read_graph_h5(__return_storage_ptr___00,sVar2,pfVar7);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar3 == 0) {
      pcVar1 = (input_filename->_M_dataplus)._M_p;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar1,pcVar1 + input_filename->_M_string_length);
      read_graph_flagser(__return_storage_ptr__,&local_80,params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::operator+(&local_60,"The input format \"",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
  *plVar6 = (long)(plVar6 + 2);
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,(string *)&stack0xffffffffffffff60);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

filtered_directed_graph_t read_filtered_directed_graph(std::string input_filename, const flagser_parameters& params) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "reading in the graph" << std::flush << "\r";
#endif

	if (params.input_format == "h5" || params.hdf5_type.size() > 0 ||
	    (input_filename.rfind(".h5") != std::string::npos)) {
		return read_graph_h5(input_filename, params);
	}
	if (params.input_format == "flagser") return read_graph_flagser(input_filename, params);

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K";
#endif

	std::string err_msg = "The input format \"" + params.input_format + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}